

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O2

void __thiscall
despot::util::tinyxml::TiXmlParsingData::Stamp
          (TiXmlParsingData *this,char *now,TiXmlEncoding encoding)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  byte *pbVar5;
  byte *pbVar6;
  int iVar7;
  bool bVar8;
  
  if (now == (char *)0x0) {
    __assert_fail("now",
                  "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxmlparser.cpp"
                  ,0xc0,
                  "void despot::util::tinyxml::TiXmlParsingData::Stamp(const char *, TiXmlEncoding)"
                 );
  }
  iVar3 = this->tabsize;
  if (0 < iVar3) {
    if ((byte *)this->stamp == (byte *)0x0) {
      __assert_fail("p",
                    "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxmlparser.cpp"
                    ,0xcb,
                    "void despot::util::tinyxml::TiXmlParsingData::Stamp(const char *, TiXmlEncoding)"
                   );
    }
    iVar7 = (this->cursor).row;
    iVar4 = (this->cursor).col;
    pbVar6 = (byte *)this->stamp;
LAB_00179832:
    if (pbVar6 < now) {
      bVar1 = *pbVar6;
      if (bVar1 != 9) {
        if (bVar1 == 10) {
          bVar8 = pbVar6[1] == 0xd;
        }
        else {
          if (bVar1 != 0xd) {
            if (bVar1 == 0xef) {
              if (encoding == TIXML_ENCODING_UTF8) {
                bVar1 = pbVar6[1];
                if ((bVar1 != 0) && (bVar2 = pbVar6[2], bVar2 != 0)) {
                  if ((bVar2 == 0xbf && bVar1 == 0xbb) ||
                     ((bVar1 == 0xbf && ((bVar2 == 0xbe || (bVar2 == 0xbf)))))) {
                    pbVar6 = pbVar6 + 3;
                  }
                  else {
                    iVar4 = iVar4 + 1;
                    pbVar6 = pbVar6 + 3;
                  }
                }
              }
              else {
                iVar4 = iVar4 + 1;
                pbVar6 = pbVar6 + 1;
              }
            }
            else {
              if (bVar1 == 0) {
                return;
              }
              if (encoding == TIXML_ENCODING_UTF8) {
                iVar4 = iVar4 + 1;
                pbVar6 = pbVar6 + *(int *)(TiXmlBase::utf8ByteTable + (ulong)bVar1 * 4);
              }
              else {
                iVar4 = iVar4 + 1;
                pbVar6 = pbVar6 + 1;
              }
            }
            goto LAB_00179832;
          }
          bVar8 = pbVar6[1] == 10;
        }
        iVar7 = iVar7 + 1;
        pbVar5 = pbVar6 + 2;
        pbVar6 = pbVar6 + 1;
        if (bVar8) {
          pbVar6 = pbVar5;
        }
        iVar4 = 0;
        goto LAB_00179832;
      }
      pbVar6 = pbVar6 + 1;
      iVar4 = (iVar4 / iVar3 + 1) * iVar3;
      goto LAB_00179832;
    }
    (this->cursor).row = iVar7;
    (this->cursor).col = iVar4;
    if (iVar7 < -1) {
      __assert_fail("cursor.row >= -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxmlparser.cpp"
                    ,0x127,
                    "void despot::util::tinyxml::TiXmlParsingData::Stamp(const char *, TiXmlEncoding)"
                   );
    }
    if (iVar4 < -1) {
      __assert_fail("cursor.col >= -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxmlparser.cpp"
                    ,0x128,
                    "void despot::util::tinyxml::TiXmlParsingData::Stamp(const char *, TiXmlEncoding)"
                   );
    }
    this->stamp = (char *)pbVar6;
  }
  return;
}

Assistant:

void TiXmlParsingData::Stamp(const char* now, TiXmlEncoding encoding) {
	assert(now);

	// Do nothing if the tabsize is 0.
	if (tabsize < 1) {
		return;
	}

	// Get the current row, column.
	int row = cursor.row;
	int col = cursor.col;
	const char* p = stamp;
	assert(p);

	while (p < now) {
		// Treat p as unsigned, so we have a happy compiler.
		const unsigned char* pU = (const unsigned char*) p;

		// Code contributed by Fletcher Dunn: (modified by lee)
		switch (*pU) {
		case 0:
			// We *should* never get here, but in case we do, don't
			// advance past the terminating null character, ever
			return;

		case '\r':
			// bump down to the next line
			++row;
			col = 0;
			// Eat the character
			++p;

			// Check for \r\n sequence, and treat this as a single character
			if (*p == '\n') {
				++p;
			}
			break;

		case '\n':
			// bump down to the next line
			++row;
			col = 0;

			// Eat the character
			++p;

			// Check for \n\r sequence, and treat this as a single
			// character.  (Yes, this bizarre thing does occur still
			// on some arcane platforms...)
			if (*p == '\r') {
				++p;
			}
			break;

		case '\t':
			// Eat the character
			++p;

			// Skip to next tab stop
			col = (col / tabsize + 1) * tabsize;
			break;

		case TIXML_UTF_LEAD_0:
			if (encoding == TIXML_ENCODING_UTF8) {
				if (*(p + 1) && *(p + 2)) {
					// In these cases, don't advance the column. These are
					// 0-width spaces.
					if (*(pU + 1) == TIXML_UTF_LEAD_1
						&& *(pU + 2) == TIXML_UTF_LEAD_2)
						p += 3;
					else if (*(pU + 1) == 0xbfU && *(pU + 2) == 0xbeU)
						p += 3;
					else if (*(pU + 1) == 0xbfU && *(pU + 2) == 0xbfU)
						p += 3;
					else {
						p += 3;
						++col;
					} // A normal character.
				}
			} else {
				++p;
				++col;
			}
			break;

		default:
			if (encoding == TIXML_ENCODING_UTF8) {
				// Eat the 1 to 4 byte utf8 character.
				int step = TiXmlBase::utf8ByteTable[*((const unsigned char*) p)];
				if (step == 0)
					step = 1; // Error case from bad encoding, but handle gracefully.
				p += step;

				// Just advance one column, of course.
				++col;
			} else {
				++p;
				++col;
			}
			break;
		}
	}
	cursor.row = row;
	cursor.col = col;
	assert(cursor.row >= -1);
	assert(cursor.col >= -1);
	stamp = p;
	assert(stamp);
}